

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O0

void print_usage(void)

{
  printf("Usage: [options] [mode] inpath/infile [outfile]\n");
  printf("\n");
  printf("Modes:\n");
  printf("c - Compress \"infile\" to \"outfile\"\n");
  printf("d - Decompress \"infile\" to \"outfile\"\n");
  printf("a - Recursively compress all files under \"inpath\"\n");
  printf("\n");
  printf("Options:\n");
  printf("-m[0-4] - Compression level: 0=fastest, 1=faster, 2=default, 3=better, 4=uber\n");
  printf("          Default is uber (4).\n");
  printf("-d[15-29] - Set log2 dictionary size, max. is 26 on x86 platforms, 29 on x64.\n");
  printf("          Default is 26 (64MB) on x86, 28 (256MB) on x64.\n");
  printf("-c - Do not compute or verify adler32 checksum during decompression (faster).\n");
  printf("-u - Use unbuffered decompression on files that can fit into memory.\n");
  printf("     Unbuffered decompression is faster, but may have more I/O overhead.\n");
  printf("-t[0-16] - Number of compression helper threads. Default=# CPU\'s-1.\n");
  printf("           Note: The total number of threads will be 1 + num_helper_threads,\n");
  printf("           because the main thread is counted separately.\n");
  printf("-v - Immediately decompress compressed file after compression for verification.\n");
  printf("-p - Use Polar codes in all higher compression levels (faster decompression).\n");
  printf("-x - Extreme parsing, for slight compression gain (Uber only, MUCH slower).\n");
  printf("-e - Enable deterministic parsing for slightly higher compression and\n");
  printf("     predictable output files when enabled, but less scalability.\n");
  printf("     The default is disabled, so the generated output data may slightly vary\n");
  printf("     between runs when multithreaded compression is enabled.\n");
  return;
}

Assistant:

static void print_usage()
{
   printf("Usage: [options] [mode] inpath/infile [outfile]\n");
   printf("\n");
   printf("Modes:\n");
   printf("c - Compress \"infile\" to \"outfile\"\n");
   printf("d - Decompress \"infile\" to \"outfile\"\n");
   printf("a - Recursively compress all files under \"inpath\"\n");
   printf("\n");
   printf("Options:\n");
   printf("-m[0-4] - Compression level: 0=fastest, 1=faster, 2=default, 3=better, 4=uber\n");
   printf("          Default is uber (4).\n");
   printf("-d[15-29] - Set log2 dictionary size, max. is 26 on x86 platforms, 29 on x64.\n");
   printf("          Default is 26 (64MB) on x86, 28 (256MB) on x64.\n");
   printf("-c - Do not compute or verify adler32 checksum during decompression (faster).\n");
   printf("-u - Use unbuffered decompression on files that can fit into memory.\n");
   printf("     Unbuffered decompression is faster, but may have more I/O overhead.\n");
   printf("-t[0-16] - Number of compression helper threads. Default=# CPU's-1.\n");
   printf("           Note: The total number of threads will be 1 + num_helper_threads,\n");
   printf("           because the main thread is counted separately.\n");
   printf("-v - Immediately decompress compressed file after compression for verification.\n");
   printf("-p - Use Polar codes in all higher compression levels (faster decompression).\n");
   printf("-x - Extreme parsing, for slight compression gain (Uber only, MUCH slower).\n");
   printf("-e - Enable deterministic parsing for slightly higher compression and\n");
   printf("     predictable output files when enabled, but less scalability.\n");
   printf("     The default is disabled, so the generated output data may slightly vary\n");
   printf("     between runs when multithreaded compression is enabled.\n");
}